

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O3

ref<immutable::transient_rrb<char,_false,_5>_> __thiscall
immutable::transient_rrb_push<char,false,5>
          (immutable *this,ref<immutable::transient_rrb<char,_false,_5>_> *trrb,char element)

{
  uint32_t *puVar1;
  guid_type guid;
  leaf_node<char,_false> *plVar2;
  internal_node<char,_false> *piVar3;
  rrb_size_table<false> *prVar4;
  byte bVar5;
  ref<immutable::rrb_details::internal_node<char,_false>_> *to_set;
  ref<immutable::rrb_details::internal_node<char,false>> *prVar6;
  internal_node<char,_false> *p_node;
  tree_node<char,_false> *ptVar7;
  char *__function;
  uint uVar8;
  uint uVar9;
  transient_rrb<char,_false,_5> *ptVar10;
  uint32_t uVar11;
  uint32_t k;
  uint uVar12;
  uint32_t uVar13;
  uint32_t empty_height;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old_tail;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_58;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_50;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_48;
  internal_node<char,_false> *local_40;
  transient_rrb<char,_false,_5> *local_38;
  
  rrb_details::check_transience<char,false,5>(trrb);
  ptVar10 = trrb->ptr;
  if (ptVar10 != (transient_rrb<char,_false,_5> *)0x0) {
    if ((ulong)ptVar10->tail_len < 0x20) {
      plVar2 = (ptVar10->tail).ptr;
      if (plVar2 != (leaf_node<char,_false> *)0x0) {
        plVar2->child[ptVar10->tail_len] = element;
        ptVar10 = trrb->ptr;
        if (ptVar10 == (transient_rrb<char,_false,_5> *)0x0) goto LAB_0013f09e;
        ptVar10->cnt = ptVar10->cnt + 1;
        ptVar10->tail_len = ptVar10->tail_len + 1;
        plVar2 = (ptVar10->tail).ptr;
        if (plVar2 != (leaf_node<char,_false> *)0x0) {
          puVar1 = &plVar2->len;
          *puVar1 = *puVar1 + 1;
          *(transient_rrb<char,_false,_5> **)this = ptVar10;
          ptVar10->_ref_count = ptVar10->_ref_count + 1;
          return (ref<immutable::transient_rrb<char,_false,_5>_>)
                 (transient_rrb<char,_false,_5> *)this;
        }
      }
LAB_0013f0b5:
      __function = 
      "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
      ;
      goto LAB_0013f0ca;
    }
    ptVar10->cnt = ptVar10->cnt + 1;
    guid = ptVar10->guid;
    local_48.ptr = (leaf_node<char,_false> *)malloc(0x38);
    (local_48.ptr)->type = LEAF_NODE;
    (local_48.ptr)->child = (char *)(local_48.ptr + 1);
    (local_48.ptr)->guid = guid;
    *(char *)&local_48.ptr[1].type = element;
    (local_48.ptr)->len = 1;
    (local_48.ptr)->_ref_count = 1;
    ptVar10->tail_len = 1;
    local_60.ptr = (ptVar10->tail).ptr;
    if (local_60.ptr != (leaf_node<char,_false> *)0x0) {
      (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&ptVar10->tail,&local_48);
    ptVar10 = trrb->ptr;
    if (ptVar10 != (transient_rrb<char,_false,_5> *)0x0) {
      piVar3 = (internal_node<char,_false> *)(ptVar10->root).ptr;
      if (piVar3 == (internal_node<char,_false> *)0x0) {
        ptVar10->shift = 0;
        if (local_60.ptr != (leaf_node<char,_false> *)0x0) {
          (local_60.ptr)->_ref_count = (local_60.ptr)->_ref_count + 1;
        }
        (ptVar10->root).ptr = (tree_node<char,_false> *)local_60.ptr;
        local_50.ptr = (tree_node<char,_false> *)0x0;
        ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_50);
        ptVar10 = trrb->ptr;
        *(transient_rrb<char,_false,_5> **)this = ptVar10;
        if (ptVar10 != (transient_rrb<char,_false,_5> *)0x0) {
          ptVar10->_ref_count = ptVar10->_ref_count + 1;
        }
        goto LAB_0013f052;
      }
      uVar11 = ptVar10->cnt;
      piVar3->_ref_count = piVar3->_ref_count + 1;
      uVar12 = ptVar10->shift;
      empty_height = 0;
      local_58.ptr = piVar3;
      local_38 = (transient_rrb<char,_false,_5> *)this;
      if (uVar12 < 6) {
        uVar11 = 0;
      }
      else {
        uVar9 = uVar11 - 2;
        uVar11 = 0;
        uVar13 = 0;
        do {
          prVar4 = ((local_58.ptr)->size_table).ptr;
          if (prVar4 == (rrb_size_table<false> *)0x0) {
            bVar5 = (byte)uVar12;
            k = uVar11;
            if (uVar9 >> (bVar5 + 5 & 0x1f) == 0) {
              uVar8 = uVar9 >> (bVar5 & 0x1f) & 0x1f;
              uVar9 = uVar9 & ~(0x1f << (bVar5 & 0x1f));
              goto LAB_0013edd4;
            }
LAB_0013ee6e:
            empty_height = uVar13 + (uVar12 - 6) / 5 + 2;
            goto LAB_0013ee85;
          }
          uVar8 = (local_58.ptr)->len - 1;
          if (uVar8 == 0) {
            uVar8 = 0;
            uVar11 = uVar13 + 1;
          }
          else {
            uVar9 = uVar9 - prVar4->size[(local_58.ptr)->len - 2];
LAB_0013edd4:
            if (uVar8 < 0x1f) {
              uVar11 = uVar13 + 1;
            }
          }
          empty_height = uVar13 + 1;
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    (&local_58,(local_58.ptr)->child + uVar8);
          k = empty_height;
          if (local_58.ptr == (internal_node<char,_false> *)0x0) goto LAB_0013ee6e;
          uVar12 = uVar12 - 5;
          uVar13 = empty_height;
        } while (5 < uVar12);
      }
      k = uVar11;
      if ((uVar12 != 0) && (empty_height = empty_height + 1, (local_58.ptr)->len < 0x20)) {
        k = empty_height;
      }
LAB_0013ee85:
      if (k != 0) {
        to_set = rrb_details::mutate_first_k<char,false,5>(trrb,k);
        prVar6 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                 rrb_details::new_editable_path<char,false,5>(to_set,empty_height - k,guid);
        this = (immutable *)local_38;
        ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar6,&local_60);
LAB_0013f039:
        ptVar10 = trrb->ptr;
        *(transient_rrb<char,_false,_5> **)this = ptVar10;
        if (ptVar10 != (transient_rrb<char,_false,_5> *)0x0) {
          ptVar10->_ref_count = ptVar10->_ref_count + 1;
        }
        rrb_details::release<char>(local_58.ptr);
LAB_0013f052:
        if ((local_60.ptr != (leaf_node<char,_false> *)0x0) &&
           (uVar11 = (local_60.ptr)->_ref_count, (local_60.ptr)->_ref_count = uVar11 - 1,
           uVar11 == 1)) {
          free(local_60.ptr);
        }
        if ((local_48.ptr != (leaf_node<char,_false> *)0x0) &&
           (uVar11 = (local_48.ptr)->_ref_count, (local_48.ptr)->_ref_count = uVar11 - 1,
           uVar11 == 1)) {
          free(local_48.ptr);
        }
        return (ref<immutable::transient_rrb<char,_false,_5>_>)(transient_rrb<char,_false,_5> *)this
        ;
      }
      ptVar10 = trrb->ptr;
      if (ptVar10 != (transient_rrb<char,_false,_5> *)0x0) {
        local_40 = (internal_node<char,_false> *)(ptVar10->root).ptr;
        if (local_40 != (internal_node<char,_false> *)0x0) {
          local_40->_ref_count = local_40->_ref_count + 1;
        }
        p_node = (internal_node<char,_false> *)malloc(0x120);
        p_node->type = INTERNAL_NODE;
        piVar3 = p_node + 1;
        p_node->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)piVar3;
        (p_node->size_table).ptr = (rrb_size_table<false> *)0x0;
        memset(piVar3,0,0x100);
        p_node->guid = guid;
        p_node->len = 2;
        p_node->_ref_count = 1;
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar3,&ptVar10->root);
        this = (immutable *)local_38;
        piVar3 = local_40;
        ptVar10 = trrb->ptr;
        if (ptVar10 != (transient_rrb<char,_false,_5> *)0x0) {
          p_node->_ref_count = p_node->_ref_count + 1;
          local_50.ptr = (ptVar10->root).ptr;
          (ptVar10->root).ptr = (tree_node<char,_false> *)p_node;
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_50);
          ptVar10 = trrb->ptr;
          if (ptVar10 != (transient_rrb<char,_false,_5> *)0x0) {
            ptVar10->shift = ptVar10->shift + 5;
            if (piVar3 == (internal_node<char,_false> *)0x0) {
              __function = 
              "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
              ;
              goto LAB_0013f0ca;
            }
            if ((piVar3->type != LEAF_NODE) &&
               ((piVar3->size_table).ptr != (rrb_size_table<false> *)0x0)) {
              ptVar7 = (tree_node<char,_false> *)malloc(0x90);
              *(tree_node<char,_false> **)ptVar7 = ptVar7 + 1;
              ptVar7->guid = guid;
              if (local_60.ptr == (leaf_node<char,_false> *)0x0) goto LAB_0013f0b5;
              ptVar7[1].type = ~(local_60.ptr)->len + ptVar10->cnt;
              ptVar7[1].len = ptVar10->cnt - 1;
              ptVar7->_ref_count = 1;
              local_50.ptr = ptVar7;
              ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                        (&p_node->size_table,
                         (ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_50);
              if ((local_50.ptr != (tree_node<char,_false> *)0x0) &&
                 (uVar11 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar11 - 1,
                 uVar11 == 1)) {
                free(local_50.ptr);
              }
              ptVar10 = trrb->ptr;
              if (ptVar10 == (transient_rrb<char,_false,_5> *)0x0) goto LAB_0013f09e;
            }
            prVar6 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                     rrb_details::new_editable_path<char,false,5>
                               ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                (*(long *)&(ptVar10->root).ptr[1]._ref_count + 8),empty_height,guid)
            ;
            ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar6,&local_60);
            rrb_details::release<char>(p_node);
            rrb_details::release<char>(piVar3);
            goto LAB_0013f039;
          }
        }
      }
    }
  }
LAB_0013f09e:
  __function = 
  "T *immutable::ref<immutable::transient_rrb<char, false>>::operator->() const [T = immutable::transient_rrb<char, false>]"
  ;
LAB_0013f0ca:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> transient_rrb_push(ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, T element)
    {
    using namespace rrb_details;
    check_transience(trrb);
    if (trrb->tail_len < bits<N>::rrb_branching)
      {
      T* loc = (T*)((char*)trrb->tail->child + trrb->tail_len * sizeof(T));
      loc = new(loc) T(std::move(element)); // placement new      

      //trrb->tail->child[trrb->tail_len] = std::move(element);
      trrb->cnt++;
      trrb->tail_len++;
      trrb->tail->len++;
      // ^ consider deferring incrementing this until insertion and/or persistentified.
      return trrb;
      }

    trrb->cnt++;
    guid_type guid = trrb->guid;
    ref<leaf_node<T, atomic_ref_counting>> new_tail = transient_leaf_node_create<T, atomic_ref_counting, N>();
    new_tail->guid = guid;
    
    T* loc = (T*)((char*)new_tail->child);
    loc = new(loc) T(std::move(element)); // placement new   

    //new_tail->child[0] = std::move(element);
    new_tail->len = 1;
    trrb->tail_len = 1;

    ref<leaf_node<T, atomic_ref_counting>> old_tail = trrb->tail;
    trrb->tail = new_tail;

    if (trrb->root.ptr == nullptr)
      { // If it's  null, we can't just mutate it down.
      trrb->shift = 0;
      trrb->root = old_tail;
      return trrb;
      }
    // mutable count starts here

    // TODO: Can find last rightmost jump in constant time for pvec subvecs:
    // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

    uint32_t index = trrb->cnt - 2;

    uint32_t nodes_to_mutate = 0;
    uint32_t nodes_visited = 0;
    uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                      // mutable node (or the element, if we can mutate the leaf)
    ref<internal_node<T, atomic_ref_counting>> current = trrb->root;

    uint32_t shift = trrb->shift;

    // checking all non-leaf nodes (or if tail, all but the lowest two levels)
    while (shift > bits<N>::rrb_bits)
      {
      // calculate child index
      uint32_t child_index;
      if (current->size_table.ptr == nullptr)
        {
        // some check here to ensure we're not overflowing the pvec subvec.
        // important to realise that this only needs to be done once in a better
        // impl, the same way the size_table check only has to be done until it's
        // false.
        const uint32_t prev_shift = shift + bits<N>::rrb_bits;
        if (index >> prev_shift > 0)
          {
          nodes_visited++; // this could possibly be done earlier in the code.
          goto mutable_count_end;
          }
        child_index = (index >> shift) & bits<N>::rrb_mask;
        // index filtering is not necessary when the check above is performed at
        // most once.
        index &= ~(bits<N>::rrb_mask << shift);
        }
      else
        {
        // no need for sized_pos here, luckily.
        child_index = current->len - 1;
        // Decrement index
        if (child_index != 0)
          {
          index -= current->size_table->size[child_index - 1];
          }
        }
      nodes_visited++;
      if (child_index < bits<N>::rrb_mask)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;
        }

      current = current->child[child_index];
      // This will only happen in a pvec subtree
      if (current.ptr == nullptr)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;

        // if next element we're looking at is null, we can mutate all above. Good
        // times.
        goto mutable_count_end;
        }
      shift -= bits<N>::rrb_bits;
      }
    // if we're here, we're at the leaf node (or lowest non-leaf), which is
    // `current`

    // no need to even use index here: We know it'll be placed at current->len,
    // if there's enough space. That check is easy.
    if (shift != 0)
      {
      nodes_visited++;
      if (current->len < bits<N>::rrb_branching)
        {
        nodes_to_mutate = nodes_visited;
        pos = current->len;
        }
      }

  mutable_count_end:
    // GURRHH, nodes_visited is not yet handled nicely. loop down to get
    // nodes_visited set straight.
    while (shift > bits<N>::rrb_bits)
      {
      nodes_visited++;
      shift -= bits<N>::rrb_bits;
      }

    // Increasing height of tree.
    if (nodes_to_mutate == 0)
      {
      ref<internal_node<T, atomic_ref_counting>> old_root = trrb->root;
      ref<internal_node<T, atomic_ref_counting>> new_root = transient_internal_node_create<T, atomic_ref_counting, N>();
      new_root->guid = guid;
      new_root->len = 2;
      new_root->child[0] = trrb->root;
      trrb->root = new_root;
      trrb->shift = trrb->shift + bits<N>::rrb_bits;

      // create size table if the original rrb root has a size table.
      if (old_root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)old_root.ptr)->size_table.ptr != nullptr)
        {
        rrb_size_table<atomic_ref_counting>* table = transient_size_table_create<N, atomic_ref_counting>();
        table->guid = guid;
        table->size[0] = trrb->cnt - (old_tail->len + 1);
        // If we insert the tail, the old size minus (new size minus one) the old
        // tail size will be the amount of elements in the left branch. If there
        // is no tail, the size is just the old rrb-tree.

        table->size[1] = trrb->cnt - 1;
        // If we insert the tail, the old size would include the tail.
        // Consequently, it has to be the old size. If we have no tail, we append
        // a single element to the old vector, therefore it has to be one more
        // than the original (which means it is zero)

        new_root->size_table = table;
        }

      // nodes visited == original rrb tree height. Nodes visited > 0.
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(&((internal_node<T, atomic_ref_counting> *)trrb->root.ptr)->child[1], nodes_visited, guid);
      *to_set = old_tail;
      }
    else
      {
      ref<internal_node<T, atomic_ref_counting>>* node = mutate_first_k(trrb, nodes_to_mutate);
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(node, nodes_visited - nodes_to_mutate, guid);
      *to_set = old_tail;
      }

    return trrb;
    }